

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall cmCPackRPMGenerator::PackageComponents(cmCPackRPMGenerator *this,bool ignoreGroup)

{
  cmCPackLog *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  uint uVar6;
  char *pcVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  pointer ppVar11;
  pointer ppVar12;
  ostream *poVar13;
  size_type sVar14;
  bool local_139a;
  bool local_1382;
  bool local_136a;
  byte local_1342;
  string local_1308 [32];
  undefined1 local_12e8 [8];
  ostringstream cmCPackLog_msg_7;
  _Self local_1170;
  _Base_ptr local_1168;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_1160;
  iterator compIt_5;
  undefined1 local_1138 [8];
  ostringstream cmCPackLog_msg_6;
  _Self local_fc0;
  _Base_ptr local_fb8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_fb0;
  iterator compIt_4;
  undefined1 local_f88 [8];
  ostringstream cmCPackLog_msg_5;
  _Self local_e10;
  _Base_ptr local_e08;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
  local_e00;
  iterator compGIt_2;
  string local_df0;
  string local_dd0 [32];
  undefined1 local_db0 [8];
  ostringstream cmCPackLog_msg_4;
  _Self local_c38;
  allocator<char> local_c29;
  string local_c28;
  char *local_c08;
  char *local_c00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf0;
  undefined1 local_be8 [8];
  string component_5;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_bb8;
  iterator compIt_3;
  iterator mainCompIt_1;
  undefined1 local_b88 [8];
  ostringstream cmCPackLog_msg_3;
  _Self local_a10;
  _Self local_a08;
  allocator<char> local_9f9;
  string local_9f8;
  string local_9d8 [32];
  undefined1 local_9b8 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_820 [8];
  string component_4;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_7f0;
  iterator compIt_2;
  iterator mainCompIt;
  undefined1 local_7c0 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_628 [8];
  string component_3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
  local_5f8;
  iterator compGIt_1;
  iterator mainCompGIt;
  allocator<char> local_5c1;
  undefined1 local_5c0 [8];
  string mainComponentUpper;
  string local_598;
  allocator<char> local_571;
  string local_570;
  allocator<char> local_549;
  string local_548;
  string local_528 [32];
  undefined1 local_508 [8];
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  char *local_308;
  char *local_300;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  undefined1 local_2e8 [8];
  string component_2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_2b8;
  iterator compIt_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  char *local_228;
  char *local_220;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  undefined1 local_208 [8];
  string component_1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
  local_1d8;
  iterator compGIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  char *local_148;
  char *local_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  undefined1 local_128 [8];
  string component;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_f8;
  iterator compIt;
  undefined1 local_e8 [4];
  bool shouldSet;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  char *local_78;
  char *mainComponent;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string initialTopLevel;
  int retval;
  bool ignoreGroup_local;
  cmCPackRPMGenerator *this_local;
  
  initialTopLevel.field_2._8_4_ = 1;
  initialTopLevel.field_2._M_local_buf[0xf] = ignoreGroup;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CPACK_TEMPORARY_DIRECTORY",&local_59);
  pcVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,pcVar7,(allocator<char> *)((long)&mainComponent + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&mainComponent + 3));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CPACK_RPM_MAIN_COMPONENT",&local_99);
  pcVar7 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  local_78 = pcVar7;
  std::allocator<char>::allocator();
  compIt._M_node._6_1_ = 0;
  compIt._M_node._5_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",&local_c1);
  bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_c0);
  local_1342 = 0;
  if (bVar3) {
    std::allocator<char>::allocator();
    compIt._M_node._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e8,"CPACK_RPM_DEBUGINFO_PACKAGE",
               (allocator<char> *)((long)&compIt._M_node + 7));
    compIt._M_node._5_1_ = 1;
    bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,(string *)local_e8);
    local_1342 = bVar3 ^ 0xff;
  }
  if ((compIt._M_node._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)local_e8);
  }
  if ((compIt._M_node._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&compIt._M_node + 7));
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  if ((local_1342 & 1) != 0) {
    compIt._M_node._4_1_ = 1;
    if ((initialTopLevel.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
      ::_Rb_tree_iterator(&local_1d8);
      local_1d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
           ::begin(&(this->super_cmCPackGenerator).ComponentGroups);
      while( true ) {
        component_1.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
             ::end(&(this->super_cmCPackGenerator).ComponentGroups);
        bVar3 = std::operator!=(&local_1d8,(_Self *)((long)&component_1.field_2 + 8));
        if (!bVar3) break;
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                  ::operator->(&local_1d8);
        std::__cxx11::string::string((string *)local_208,(string *)ppVar11);
        local_210._M_current = (char *)std::__cxx11::string::begin();
        local_218._M_current = (char *)std::__cxx11::string::end();
        local_220 = (char *)std::__cxx11::string::begin();
        local_228 = (char *)std::
                            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                      (local_210,local_218,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_220,toupper);
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                  ::operator->(&local_1d8);
        compIt_1._M_node._7_1_ = 0;
        compIt_1._M_node._6_1_ = 0;
        std::operator+(&local_268,"CPACK_RPM_",&ppVar11->first);
        std::operator+(&local_248,&local_268,"_DEBUGINFO_PACKAGE");
        bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_248);
        local_1382 = true;
        if (!bVar3) {
          std::operator+(&local_2a8,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
          compIt_1._M_node._7_1_ = 1;
          std::operator+(&local_288,&local_2a8,"_DEBUGINFO_PACKAGE");
          compIt_1._M_node._6_1_ = 1;
          local_1382 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_288);
        }
        if ((compIt_1._M_node._6_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_288);
        }
        if ((compIt_1._M_node._7_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2a8);
        }
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        if (local_1382 == false) {
          compGIt._M_node._0_4_ = 0;
        }
        else {
          compIt._M_node._4_1_ = 0;
          compGIt._M_node._0_4_ = 5;
        }
        std::__cxx11::string::~string((string *)local_208);
        if ((int)compGIt._M_node != 0) break;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
        ::operator++(&local_1d8);
      }
      if ((compIt._M_node._4_1_ & 1) != 0) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::_Rb_tree_iterator(&local_2b8);
        local_2b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::begin(&(this->super_cmCPackGenerator).Components);
        while( true ) {
          component_2.field_2._8_8_ =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::end(&(this->super_cmCPackGenerator).Components);
          bVar3 = std::operator!=(&local_2b8,(_Self *)((long)&component_2.field_2 + 8));
          if (!bVar3) break;
          ppVar12 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                    ::operator->(&local_2b8);
          if ((ppVar12->second).Group == (cmCPackComponentGroup *)0x0) {
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                      ::operator->(&local_2b8);
            std::__cxx11::string::string((string *)local_2e8,(string *)ppVar12);
            local_2f0._M_current = (char *)std::__cxx11::string::begin();
            local_2f8._M_current = (char *)std::__cxx11::string::end();
            local_300 = (char *)std::__cxx11::string::begin();
            local_308 = (char *)std::
                                transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                          (local_2f0,local_2f8,
                                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            )local_300,toupper);
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                      ::operator->(&local_2b8);
            std::operator+(&local_348,"CPACK_RPM_",&ppVar12->first);
            std::operator+(&local_328,&local_348,"_DEBUGINFO_PACKAGE");
            bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_328);
            local_139a = true;
            if (!bVar3) {
              std::operator+(&local_388,"CPACK_RPM_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2e8);
              std::operator+(&local_368,&local_388,"_DEBUGINFO_PACKAGE");
              local_139a = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_368);
              std::__cxx11::string::~string((string *)&local_368);
              std::__cxx11::string::~string((string *)&local_388);
            }
            std::__cxx11::string::~string((string *)&local_328);
            std::__cxx11::string::~string((string *)&local_348);
            if (local_139a == false) {
              compGIt._M_node._0_4_ = 0;
            }
            else {
              compIt._M_node._4_1_ = 0;
              compGIt._M_node._0_4_ = 8;
            }
            std::__cxx11::string::~string((string *)local_2e8);
            if ((int)compGIt._M_node != 0) break;
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
          ::operator++(&local_2b8);
        }
      }
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::_Rb_tree_iterator(&local_f8);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
           ::begin(&(this->super_cmCPackGenerator).Components);
      while( true ) {
        component.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::end(&(this->super_cmCPackGenerator).Components);
        bVar3 = std::operator!=(&local_f8,(_Self *)((long)&component.field_2 + 8));
        if (!bVar3) break;
        ppVar12 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                  ::operator->(&local_f8);
        std::__cxx11::string::string((string *)local_128,(string *)ppVar12);
        local_130._M_current = (char *)std::__cxx11::string::begin();
        local_138._M_current = (char *)std::__cxx11::string::end();
        local_140 = (char *)std::__cxx11::string::begin();
        local_148 = (char *)std::
                            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                      (local_130,local_138,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_140,toupper);
        ppVar12 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                  ::operator->(&local_f8);
        compGIt._M_node._7_1_ = 0;
        compGIt._M_node._6_1_ = 0;
        std::operator+(&local_188,"CPACK_RPM_",&ppVar12->first);
        std::operator+(&local_168,&local_188,"_DEBUGINFO_PACKAGE");
        bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_168);
        local_136a = true;
        if (!bVar3) {
          std::operator+(&local_1c8,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128);
          compGIt._M_node._7_1_ = 1;
          std::operator+(&local_1a8,&local_1c8,"_DEBUGINFO_PACKAGE");
          compGIt._M_node._6_1_ = 1;
          local_136a = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_1a8);
        }
        if ((compGIt._M_node._6_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1a8);
        }
        if ((compGIt._M_node._7_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        if (local_136a == false) {
          compGIt._M_node._0_4_ = 0;
        }
        else {
          compIt._M_node._4_1_ = 0;
          compGIt._M_node._0_4_ = 2;
        }
        std::__cxx11::string::~string((string *)local_128);
        if ((int)compGIt._M_node != 0) break;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::operator++(&local_f8);
      }
    }
    if ((compIt._M_node._4_1_ & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_508);
      poVar13 = std::operator<<((ostream *)local_508,"Setting ");
      poVar13 = std::operator<<(poVar13,"CPACK_RPM_DEBUGINFO_PACKAGE because ");
      poVar13 = std::operator<<(poVar13,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but ");
      poVar13 = std::operator<<(poVar13," none of the ");
      poVar13 = std::operator<<(poVar13,"CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables ");
      poVar13 = std::operator<<(poVar13,"are set.");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                      ,0xaa,pcVar7);
      std::__cxx11::string::~string(local_528);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_508);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_548,"CPACK_RPM_DEBUGINFO_PACKAGE",&local_549);
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_548,"ON");
      std::__cxx11::string::~string((string *)&local_548);
      std::allocator<char>::~allocator(&local_549);
    }
  }
  if (local_78 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_df0,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",
               (allocator<char> *)((long)&compGIt_2._M_node + 7));
    bVar5 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_df0);
    bVar3 = true;
    if (bVar5) {
      sVar14 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::size(&(this->super_cmCPackGenerator).Components);
      bVar3 = sVar14 == 1;
    }
    std::__cxx11::string::~string((string *)&local_df0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&compGIt_2._M_node + 7));
    if (bVar3) {
      if ((initialTopLevel.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
        ::_Rb_tree_iterator(&local_e00);
        local_e08 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
                    ::begin(&(this->super_cmCPackGenerator).ComponentGroups);
        local_e00._M_node = local_e08;
        while( true ) {
          local_e10._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
               ::end(&(this->super_cmCPackGenerator).ComponentGroups);
          bVar3 = std::operator!=(&local_e00,&local_e10);
          if (!bVar3) break;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f88);
          poVar13 = std::operator<<((ostream *)local_f88,"Packaging component group: ");
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                    ::operator->(&local_e00);
          poVar13 = std::operator<<(poVar13,(string *)ppVar11);
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0x128,pcVar7);
          std::__cxx11::string::~string((string *)&compIt_4);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f88);
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                    ::operator->(&local_e00);
          uVar6 = PackageOnePack(this,(string *)local_38,&ppVar11->first);
          initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
          ::operator++(&local_e00);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::_Rb_tree_iterator(&local_fb0);
        local_fb8 = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                    ::begin(&(this->super_cmCPackGenerator).Components);
        local_fb0._M_node = local_fb8;
        while( true ) {
          local_fc0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::end(&(this->super_cmCPackGenerator).Components);
          bVar3 = std::operator!=(&local_fb0,&local_fc0);
          if (!bVar3) break;
          ppVar12 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                    ::operator->(&local_fb0);
          if ((ppVar12->second).Group == (cmCPackComponentGroup *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1138);
            poVar13 = std::operator<<((ostream *)local_1138,"Component <");
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                      ::operator->(&local_fb0);
            poVar13 = std::operator<<(poVar13,(string *)&ppVar12->second);
            poVar13 = std::operator<<(poVar13,
                                      "> does not belong to any group, package it separately.");
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0x136,pcVar7);
            std::__cxx11::string::~string((string *)&compIt_5);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1138);
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                      ::operator->(&local_fb0);
            uVar6 = PackageOnePack(this,(string *)local_38,&ppVar12->first);
            initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
          ::operator++(&local_fb0);
        }
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::_Rb_tree_iterator(&local_1160);
        local_1168 = (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                     ::begin(&(this->super_cmCPackGenerator).Components);
        local_1160._M_node = local_1168;
        while( true ) {
          local_1170._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::end(&(this->super_cmCPackGenerator).Components);
          bVar3 = std::operator!=(&local_1160,&local_1170);
          if (!bVar3) break;
          ppVar12 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                    ::operator->(&local_1160);
          uVar6 = PackageOnePack(this,(string *)local_38,&ppVar12->first);
          initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
          ::operator++(&local_1160);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12e8);
      poVar13 = std::operator<<((ostream *)local_12e8,"CPACK_RPM_MAIN_COMPONENT not set but");
      poVar13 = std::operator<<(poVar13," it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE");
      std::operator<<(poVar13," being set.\n");
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                      ,0x149,pcVar7);
      std::__cxx11::string::~string(local_1308);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12e8);
      initialTopLevel.field_2._8_4_ = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_570,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",&local_571);
    bVar3 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator(&local_571);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_598,"GENERATE_SPEC_PARTS",
                 (allocator<char> *)(mainComponentUpper.field_2._M_local_buf + 0xf));
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_598,"ON");
      std::__cxx11::string::~string((string *)&local_598);
      std::allocator<char>::~allocator
                ((allocator<char> *)(mainComponentUpper.field_2._M_local_buf + 0xf));
    }
    pcVar7 = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5c0,pcVar7,&local_5c1);
    std::allocator<char>::~allocator(&local_5c1);
    _Var8._M_current = (char *)std::__cxx11::string::begin();
    _Var9._M_current = (char *)std::__cxx11::string::end();
    _Var10._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
              (_Var8,_Var9,_Var10,toupper);
    if ((initialTopLevel.field_2._M_local_buf[0xf] & 1U) == 0) {
      compGIt_1 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
                  ::end(&(this->super_cmCPackGenerator).ComponentGroups);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
      ::_Rb_tree_iterator(&local_5f8);
      local_5f8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
           ::begin(&(this->super_cmCPackGenerator).ComponentGroups);
      while( true ) {
        component_3.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
             ::end(&(this->super_cmCPackGenerator).ComponentGroups);
        bVar3 = std::operator!=(&local_5f8,(_Self *)((long)&component_3.field_2 + 8));
        if (!bVar3) break;
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                  ::operator->(&local_5f8);
        std::__cxx11::string::string((string *)local_628,(string *)ppVar11);
        _Var8._M_current = (char *)std::__cxx11::string::begin();
        _Var9._M_current = (char *)std::__cxx11::string::end();
        _Var10._M_current = (char *)std::__cxx11::string::begin();
        std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                  (_Var8,_Var9,_Var10,toupper);
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5c0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_628);
        if (_Var4) {
          compGIt_1._M_node = local_5f8._M_node;
          compGIt._M_node._0_4_ = 0xf;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
          poVar13 = std::operator<<((ostream *)local_7c0,"Packaging component group: ");
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                    ::operator->(&local_5f8);
          poVar13 = std::operator<<(poVar13,(string *)ppVar11);
          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0xcd,pcVar7);
          std::__cxx11::string::~string((string *)&mainCompIt);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                    ::operator->(&local_5f8);
          uVar6 = PackageOnePack(this,(string *)local_38,&ppVar11->first);
          initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
          compGIt._M_node._0_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_628);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
        ::operator++(&local_5f8);
      }
      compIt_2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                 ::end(&(this->super_cmCPackGenerator).Components);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::_Rb_tree_iterator(&local_7f0);
      local_7f0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
           ::begin(&(this->super_cmCPackGenerator).Components);
      while( true ) {
        component_4.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::end(&(this->super_cmCPackGenerator).Components);
        bVar3 = std::operator!=(&local_7f0,(_Self *)((long)&component_4.field_2 + 8));
        if (!bVar3) break;
        ppVar12 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                  ::operator->(&local_7f0);
        if ((ppVar12->second).Group == (cmCPackComponentGroup *)0x0) {
          ppVar12 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                    ::operator->(&local_7f0);
          std::__cxx11::string::string((string *)local_820,(string *)ppVar12);
          _Var8._M_current = (char *)std::__cxx11::string::begin();
          _Var9._M_current = (char *)std::__cxx11::string::end();
          _Var10._M_current = (char *)std::__cxx11::string::begin();
          std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                    (_Var8,_Var9,_Var10,toupper);
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_5c0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_820);
          if (_Var4) {
            compIt_2._M_node = local_7f0._M_node;
            compGIt._M_node._0_4_ = 0x14;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b8);
            poVar13 = std::operator<<((ostream *)local_9b8,"Component <");
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                      ::operator->(&local_7f0);
            poVar13 = std::operator<<(poVar13,(string *)&ppVar12->second);
            poVar13 = std::operator<<(poVar13,
                                      "> does not belong to any group, package it separately.");
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0xe7,pcVar7);
            std::__cxx11::string::~string(local_9d8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b8);
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                      ::operator->(&local_7f0);
            uVar6 = PackageOnePack(this,(string *)local_38,&ppVar12->first);
            initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
            compGIt._M_node._0_4_ = 0;
          }
          std::__cxx11::string::~string((string *)local_820);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::operator++(&local_7f0);
      }
      if (initialTopLevel.field_2._8_4_ != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9f8,"GENERATE_SPEC_PARTS",&local_9f9);
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_9f8,"OFF");
        std::__cxx11::string::~string((string *)&local_9f8);
        std::allocator<char>::~allocator(&local_9f9);
        local_a08._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
             ::end(&(this->super_cmCPackGenerator).ComponentGroups);
        bVar3 = std::operator!=(&compGIt_1,&local_a08);
        if (bVar3) {
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                    ::operator->(&compGIt_1);
          uVar6 = PackageOnePack(this,(string *)local_38,&ppVar11->first);
          initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
        }
        else {
          local_a10._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::end(&(this->super_cmCPackGenerator).Components);
          bVar3 = std::operator!=(&compIt_2,&local_a10);
          if (bVar3) {
            ppVar12 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                      ::operator->(&compIt_2);
            uVar6 = PackageOnePack(this,(string *)local_38,&ppVar12->first);
            initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b88);
            poVar13 = std::operator<<((ostream *)local_b88,"CPACK_RPM_MAIN_COMPONENT set");
            std::operator<<(poVar13," to non existing component.\n");
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0xf6,pcVar7);
            std::__cxx11::string::~string((string *)&mainCompIt_1);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b88);
            initialTopLevel.field_2._8_4_ = 0;
          }
        }
      }
    }
    else {
      compIt_3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                 ::end(&(this->super_cmCPackGenerator).Components);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::_Rb_tree_iterator(&local_bb8);
      local_bb8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
           ::begin(&(this->super_cmCPackGenerator).Components);
      while( true ) {
        component_5.field_2._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::end(&(this->super_cmCPackGenerator).Components);
        bVar3 = std::operator!=(&local_bb8,(_Self *)((long)&component_5.field_2 + 8));
        if (!bVar3) break;
        ppVar12 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                  ::operator->(&local_bb8);
        std::__cxx11::string::string((string *)local_be8,(string *)ppVar12);
        local_bf0._M_current = (char *)std::__cxx11::string::begin();
        local_bf8._M_current = (char *)std::__cxx11::string::end();
        local_c00 = (char *)std::__cxx11::string::begin();
        local_c08 = (char *)std::
                            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                      (local_bf0,local_bf8,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_c00,toupper);
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5c0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_be8);
        if (_Var4) {
          compIt_3._M_node = local_bb8._M_node;
          compGIt._M_node._0_4_ = 0x1b;
        }
        else {
          ppVar12 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                    ::operator->(&local_bb8);
          uVar6 = PackageOnePack(this,(string *)local_38,&ppVar12->first);
          initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
          compGIt._M_node._0_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_be8);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::operator++(&local_bb8);
      }
      if (initialTopLevel.field_2._8_4_ != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c28,"GENERATE_SPEC_PARTS",&local_c29);
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_c28,"OFF");
        std::__cxx11::string::~string((string *)&local_c28);
        std::allocator<char>::~allocator(&local_c29);
        local_c38._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::end(&(this->super_cmCPackGenerator).Components);
        bVar3 = std::operator!=(&compIt_3,&local_c38);
        if (bVar3) {
          ppVar12 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                    ::operator->(&compIt_3);
          uVar6 = PackageOnePack(this,(string *)local_38,&ppVar12->first);
          initialTopLevel.field_2._8_4_ = uVar6 & initialTopLevel.field_2._8_4_;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_db0);
          poVar13 = std::operator<<((ostream *)local_db0,"CPACK_RPM_MAIN_COMPONENT set");
          std::operator<<(poVar13," to non existing component.\n");
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0x119,pcVar7);
          std::__cxx11::string::~string(local_dd0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_db0);
          initialTopLevel.field_2._8_4_ = 0;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_5c0);
  }
  if (initialTopLevel.field_2._8_4_ != 0) {
    AddGeneratedPackageNames(this);
  }
  uVar2 = initialTopLevel.field_2._8_4_;
  compGIt._M_node._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_38);
  return uVar2;
}

Assistant:

int cmCPackRPMGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  const char* mainComponent = this->GetOption("CPACK_RPM_MAIN_COMPONENT");

  if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") &&
      !this->IsOn("CPACK_RPM_DEBUGINFO_PACKAGE")) {
    // check if we need to set CPACK_RPM_DEBUGINFO_PACKAGE because non of
    // the components is setting per component debuginfo package variable
    bool shouldSet = true;

    if (ignoreGroup) {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }
    } else {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compGIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }

      if (shouldSet) {
        std::map<std::string, cmCPackComponent>::iterator compIt;
        for (compIt = this->Components.begin();
             compIt != this->Components.end(); ++compIt) {
          // Does the component belong to a group?
          if (compIt->second.Group == nullptr) {
            std::string component(compIt->first);
            std::transform(component.begin(), component.end(),
                           component.begin(), ::toupper);

            if (this->IsOn("CPACK_RPM_" + compIt->first +
                           "_DEBUGINFO_PACKAGE") ||
                this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
              shouldSet = false;
              break;
            }
          }
        }
      }
    }

    if (shouldSet) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Setting "
                      << "CPACK_RPM_DEBUGINFO_PACKAGE because "
                      << "CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but "
                      << " none of the "
                      << "CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables "
                      << "are set." << std::endl);
      this->SetOption("CPACK_RPM_DEBUGINFO_PACKAGE", "ON");
    }
  }

  if (mainComponent) {
    if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE")) {
      this->SetOption("GENERATE_SPEC_PARTS", "ON");
    }

    std::string mainComponentUpper(mainComponent);
    std::transform(mainComponentUpper.begin(), mainComponentUpper.end(),
                   mainComponentUpper.begin(), ::toupper);

    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator mainCompGIt =
        this->ComponentGroups.end();

      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompGIt = compGIt;
          continue;
        }

        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          std::string component(compIt->first);
          std::transform(component.begin(), component.end(), component.begin(),
                         ::toupper);

          if (mainComponentUpper == component) {
            // main component will be handled last
            mainCompIt = compIt;
            continue;
          }

          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompGIt != this->ComponentGroups.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompGIt->first);
        } else if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();

      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompIt = compIt;
          continue;
        }

        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
  } else if (!this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") ||
             this->Components.size() == 1) {
    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }
    }
  } else {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "CPACK_RPM_MAIN_COMPONENT not set but"
        << " it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE"
        << " being set.\n");
    retval = 0;
  }

  if (retval) {
    AddGeneratedPackageNames();
  }

  return retval;
}